

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcBlendEquationAdvancedTests.cpp
# Opt level: O2

IterateResult __thiscall glcts::BlendTestCaseGroup::BlendTest::iterate(BlendTest *this)

{
  RGBA b;
  pointer log;
  RenderContext *renderCtx;
  code *pcVar1;
  BlendTest *pBVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  deUint32 dVar6;
  undefined4 uVar7;
  RGBA a;
  RGBA RVar8;
  uint uVar9;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  char *layoutQualifier;
  undefined4 extraout_var_01;
  void *pvVar11;
  undefined4 extraout_var_02;
  TestError *this_00;
  uint uVar12;
  GLSLVersion glslVersion;
  uint uVar13;
  int iVar14;
  char *pcVar15;
  char *in_R8;
  uint uVar16;
  byte bVar17;
  int colorIndex;
  PixelFormat *this_01;
  RGBA local_374;
  int *local_370;
  long local_368;
  BlendTest *local_360;
  RGBA local_354;
  Vec4 srcCol;
  Vec4 dstCol;
  string frgSrc;
  Vec4 refCol;
  VertexArrayBinding posBinding;
  undefined1 local_280 [8];
  IndexType local_278;
  undefined1 *local_270;
  ShaderProgram p;
  long lVar10;
  
  iVar4 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[4])();
  iVar5 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar10 = CONCAT44(extraout_var_00,iVar5);
  log = (pointer)((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  bVar3 = IsExtensionSupported((this->super_TestCase).m_context,"GL_KHR_blend_equation_advanced");
  if (bVar3) {
    if (this->m_useAllQualifier == false) {
      pcVar15 = GetLayoutQualifierStr(this->m_mode);
    }
    else {
      pcVar15 = "blend_support_all_equations";
    }
    layoutQualifier = glu::getGLSLVersionDeclaration(this->m_glslVersion);
    GetSolidShader_abi_cxx11_
              (&frgSrc,(glcts *)pcVar15,layoutQualifier,
               "#extension GL_KHR_blend_equation_advanced : require",in_R8);
    renderCtx = ((this->super_TestCase).m_context)->m_renderCtx;
    GetDef2DVtxSrc_abi_cxx11_((string *)&srcCol,(glcts *)(ulong)this->m_glslVersion,glslVersion);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&posBinding,(char *)CONCAT44(srcCol.m_data[1],srcCol.m_data[0]),
               (allocator<char> *)&refCol);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&dstCol,frgSrc._M_dataplus._M_p,(allocator<char> *)&local_374);
    glu::makeVtxFragSources((ProgramSources *)local_280,(string *)&posBinding,(string *)&dstCol);
    glu::ShaderProgram::ShaderProgram(&p,renderCtx,(ProgramSources *)local_280);
    glu::ProgramSources::~ProgramSources((ProgramSources *)local_280);
    std::__cxx11::string::~string((string *)&dstCol);
    std::__cxx11::string::~string((string *)&posBinding);
    std::__cxx11::string::~string((string *)&srcCol);
    if (p.m_program.m_info.linkOk == false) {
      glu::operator<<((TestLog *)log,&p);
      this_00 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_00,"Compile failed",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcBlendEquationAdvancedTests.cpp"
                 ,0x3ae);
      __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    (**(code **)(lVar10 + 0x1680))(p.m_program.m_program);
    dVar6 = (**(code **)(lVar10 + 0x800))();
    glu::checkError(dVar6,"Program failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcBlendEquationAdvancedTests.cpp"
                    ,0x3b1);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_280,"aPos",(allocator<char> *)&srcCol);
    glu::va::Float(&posBinding,(string *)local_280,2,4,0,(float *)s_pos);
    std::__cxx11::string::~string((string *)local_280);
    (**(code **)(lVar10 + 0x4e8))(0xbd0);
    (**(code **)(lVar10 + 0x5e0))(0xc11);
    (**(code **)(lVar10 + 0x5e0))(0xbe2);
    (**(code **)(lVar10 + 0x100))(this->m_mode);
    dVar6 = (**(code **)(lVar10 + 0x800))();
    glu::checkError(dVar6,"BlendEquation failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcBlendEquationAdvancedTests.cpp"
                    ,0x3ba);
    local_360 = this;
    bVar3 = IsExtensionSupported
                      ((this->super_TestCase).m_context,"GL_KHR_blend_equation_advanced_coherent");
    this_01 = (PixelFormat *)((int *)CONCAT44(extraout_var,iVar4) + 2);
    local_370 = (int *)CONCAT44(extraout_var,iVar4);
    local_368 = lVar10;
    for (iVar5 = 0; pBVar2 = local_360, iVar5 < local_360->m_numColors; iVar5 = iVar5 + 1) {
      tcu::Vector<float,_4>::Vector(&srcCol);
      tcu::Vector<float,_4>::Vector(&dstCol);
      getTestColors(pBVar2,iVar5,&srcCol,&dstCol);
      iVar4 = (*((pBVar2->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[4])();
      lVar10 = local_368;
      (**(code **)(local_368 + 0x1290))
                ((long)iVar5 % (long)*(int *)CONCAT44(extraout_var_01,iVar4) & 0xffffffff,
                 (long)iVar5 / (long)*(int *)CONCAT44(extraout_var_01,iVar4) & 0xffffffff,1,1);
      (**(code **)(lVar10 + 0x1c0))
                (dstCol.m_data[0],dstCol.m_data[1],dstCol.m_data[2],dstCol.m_data[3]);
      (**(code **)(lVar10 + 0x188))(0x4000);
      if (!bVar3) {
        (**(code **)(lVar10 + 0xf0))();
      }
      pcVar1 = *(code **)(lVar10 + 0x15a0);
      uVar7 = (**(code **)(lVar10 + 0xb48))(p.m_program.m_program,"uSrcCol");
      (*pcVar1)(srcCol.m_data[0],srcCol.m_data[1],srcCol.m_data[2],srcCol.m_data[3],uVar7);
      dVar6 = (**(code **)(lVar10 + 0x800))();
      glu::checkError(dVar6,"Uniforms failed",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcBlendEquationAdvancedTests.cpp"
                      ,0x3d1);
      local_280 = (undefined1  [8])0x600000000;
      local_278 = INDEXTYPE_UINT16;
      local_270 = s_indices;
      glu::draw(((local_360->super_TestCase).m_context)->m_renderCtx,p.m_program.m_program,1,
                &posBinding,(PrimitiveList *)local_280,(DrawUtilCallback *)0x0);
      dVar6 = (**(code **)(lVar10 + 0x800))();
      glu::checkError(dVar6,"Draw failed",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcBlendEquationAdvancedTests.cpp"
                      ,0x3d6);
      if (!bVar3) {
        (**(code **)(lVar10 + 0xf0))();
      }
    }
    iVar4 = *local_370;
    iVar5 = local_370[1];
    local_370 = (int *)CONCAT44(local_370._4_4_,iVar4);
    pvVar11 = operator_new__((long)(iVar4 * iVar5 * 4));
    (**(code **)(lVar10 + 0xff0))(0xd05,1);
    (**(code **)(lVar10 + 0x1220))(0,0,(ulong)local_370 & 0xffffffff,iVar5,0x1908,0x1401,pvVar11);
    dVar6 = (**(code **)(lVar10 + 0x800))();
    glu::checkError(dVar6,"Read pixels failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcBlendEquationAdvancedTests.cpp"
                    ,0x3e1);
    bVar17 = 1;
    iVar4 = 0;
    while( true ) {
      pBVar2 = local_360;
      if (local_360->m_numColors <= iVar4) break;
      tcu::Vector<float,_4>::Vector(&srcCol);
      tcu::Vector<float,_4>::Vector(&dstCol);
      getTestColors(pBVar2,iVar4,&srcCol,&dstCol);
      iVar5 = (*((pBVar2->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[4])();
      iVar14 = iVar4 / *(int *)CONCAT44(extraout_var_02,iVar5);
      iVar5 = iVar4 % *(int *)CONCAT44(extraout_var_02,iVar5);
      Blend((glcts *)&refCol,pBVar2->m_mode,&srcCol,&dstCol);
      local_368 = CONCAT44(local_368._4_4_,iVar4);
      tcu::RGBA::RGBA((RGBA *)local_280,&refCol);
      a = tcu::PixelFormat::convertColor(this_01,(RGBA *)local_280);
      b.m_value = *(deUint32 *)((long)pvVar11 + (long)((iVar14 * (int)local_370 + iVar5) * 4));
      RVar8 = tcu::PixelFormat::getColorThreshold(this_01);
      uVar12 = (RVar8.m_value & 0xff) * 2;
      if (0xfc < uVar12) {
        uVar12 = 0xfd;
      }
      uVar13 = RVar8.m_value >> 7 & 0x1fe;
      if (0xfc < uVar13) {
        uVar13 = 0xfd;
      }
      uVar16 = RVar8.m_value >> 0xf & 0x1fe;
      if (0xfc < uVar16) {
        uVar16 = 0xfd;
      }
      uVar9 = RVar8.m_value >> 0x17 & 0xfffffffe;
      if (0xfc < uVar9) {
        uVar9 = 0xfd;
      }
      RVar8.m_value =
           uVar16 * 0x10000 + 0x20000 | uVar9 * 0x1000000 + 0x2000000 |
           uVar13 * 0x100 + 0x200 | uVar12 + 2;
      bVar3 = tcu::compareThreshold(a,b,RVar8);
      if (!bVar3) {
        local_280 = (undefined1  [8])log;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_278);
        std::operator<<((ostream *)&local_278,"(");
        std::ostream::operator<<((ostringstream *)&local_278,iVar5);
        std::operator<<((ostream *)&local_278,",");
        std::ostream::operator<<((ostringstream *)&local_278,iVar14);
        std::operator<<((ostream *)&local_278,")  ");
        std::operator<<((ostream *)&local_278,"(");
        std::ostream::operator<<((ostringstream *)&local_278,(int)local_368);
        std::operator<<((ostream *)&local_278,") ");
        std::operator<<((ostream *)&local_278,"Exceeds: ");
        tcu::operator<<((ostream *)&local_278,RVar8);
        std::operator<<((ostream *)&local_278," diff:");
        RVar8 = tcu::computeAbsDiff(a,b);
        tcu::operator<<((ostream *)&local_278,RVar8);
        std::operator<<((ostream *)&local_278,"  res:");
        tcu::operator<<((ostream *)&local_278,b);
        std::operator<<((ostream *)&local_278,"  ref:");
        tcu::operator<<((ostream *)&local_278,a);
        std::operator<<((ostream *)&local_278,"  dst:");
        tcu::RGBA::RGBA(&local_374,&dstCol);
        tcu::operator<<((ostream *)&local_278,local_374);
        std::operator<<((ostream *)&local_278,"  src:");
        tcu::RGBA::RGBA(&local_354,&srcCol);
        tcu::operator<<((ostream *)&local_278,local_354);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_280,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_278);
      }
      bVar17 = bVar17 & bVar3;
      iVar4 = (int)local_368 + 1;
    }
    pcVar15 = "Fail (results differ)";
    if (bVar17 != 0) {
      pcVar15 = "Pass";
    }
    tcu::TestContext::setTestResult
              ((local_360->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
               (byte)~bVar17 & QP_TEST_RESULT_FAIL,pcVar15);
    operator_delete__(pvVar11);
    std::__cxx11::string::~string((string *)&posBinding.binding.name);
    glu::ShaderProgram::~ShaderProgram(&p);
    std::__cxx11::string::~string((string *)&frgSrc);
  }
  else {
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
               QP_TEST_RESULT_NOT_SUPPORTED,"GL_KHR_blend_equation_advanced");
  }
  return STOP;
}

Assistant:

BlendTestCaseGroup::BlendTest::IterateResult BlendTestCaseGroup::BlendTest::iterate(void)
{
	const tcu::RenderTarget& rt  = m_context.getRenderContext().getRenderTarget();
	const tcu::PixelFormat&  pf  = rt.getPixelFormat();
	const glw::Functions&	gl  = m_context.getRenderContext().getFunctions();
	TestLog&				 log = m_testCtx.getLog();

	// Check that extension is supported.
	if (!IsExtensionSupported(m_context, "GL_KHR_blend_equation_advanced"))
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_NOT_SUPPORTED, "GL_KHR_blend_equation_advanced");
		return STOP;
	}

	// Setup program.
	std::string frgSrc =
		GetSolidShader(m_useAllQualifier ? "blend_support_all_equations" : GetLayoutQualifierStr(m_mode),
					   glu::getGLSLVersionDeclaration(m_glslVersion));
	glu::ShaderProgram p(m_context.getRenderContext(),
						 glu::makeVtxFragSources(GetDef2DVtxSrc(m_glslVersion).c_str(), frgSrc.c_str()));
	if (!p.isOk())
	{
		log << p;
		TCU_FAIL("Compile failed");
	}
	gl.useProgram(p.getProgram());
	GLU_EXPECT_NO_ERROR(gl.getError(), "Program failed");

	glu::VertexArrayBinding posBinding = glu::va::Float("aPos", 2, 4, 0, &s_pos[0]);

	// Enable blending and set blend equation.
	gl.disable(GL_DITHER);
	gl.enable(GL_SCISSOR_TEST);
	gl.enable(GL_BLEND);
	gl.blendEquation(m_mode);
	GLU_EXPECT_NO_ERROR(gl.getError(), "BlendEquation failed");

	bool needBarrier = !IsExtensionSupported(m_context, "GL_KHR_blend_equation_advanced_coherent");

	// Render loop.
	for (int colorIndex = 0; colorIndex < m_numColors; colorIndex++)
	{
		tcu::Vec4 srcCol, dstCol;
		getTestColors(colorIndex, srcCol, dstCol);

		// Get pixel to blend.
		int x, y;
		getCoordinates(colorIndex, x, y);
		gl.scissor(x, y, 1, 1);

		// Clear to destination color.
		gl.clearColor(dstCol[0], dstCol[1], dstCol[2], dstCol[3]);
		gl.clear(GL_COLOR_BUFFER_BIT);
		if (needBarrier)
			gl.blendBarrier();

		// Set source color.
		gl.uniform4f(gl.getUniformLocation(p.getProgram(), "uSrcCol"), srcCol[0], srcCol[1], srcCol[2], srcCol[3]);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Uniforms failed");

		// Draw.
		glu::draw(m_context.getRenderContext(), p.getProgram(), 1, &posBinding,
				  glu::pr::Triangles(DE_LENGTH_OF_ARRAY(s_indices), &s_indices[0]));
		GLU_EXPECT_NO_ERROR(gl.getError(), "Draw failed");
		if (needBarrier)
			gl.blendBarrier();
	}

	// Read the results.
	const int	 w			  = rt.getWidth();
	const int	 h			  = rt.getHeight();
	glw::GLubyte* resultBytes = new glw::GLubyte[4 * w * h];
	gl.pixelStorei(GL_PACK_ALIGNMENT, 1);
	gl.readPixels(0, 0, w, h, GL_RGBA, GL_UNSIGNED_BYTE, resultBytes);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Read pixels failed");

	bool pass = true;
	for (int colorIndex = 0; colorIndex < m_numColors; colorIndex++)
	{
		tcu::Vec4 srcCol, dstCol;
		getTestColors(colorIndex, srcCol, dstCol);

		// Get result and calculate reference.
		int x, y;
		getCoordinates(colorIndex, x, y);

		tcu::Vec4 refCol	= Blend(m_mode, srcCol, dstCol);
		tcu::RGBA ref		= pf.convertColor(tcu::RGBA(refCol));
		tcu::RGBA res		= tcu::RGBA::fromBytes(resultBytes + 4 * (x + w * y));
		tcu::RGBA tmp		= pf.getColorThreshold();
		tcu::RGBA threshold = tcu::RGBA(std::min(2 + 2 * tmp.getRed(), 255), std::min(2 + 2 * tmp.getGreen(), 255),
										std::min(2 + 2 * tmp.getBlue(), 255), std::min(2 + 2 * tmp.getAlpha(), 255));
		bool pixelOk = tcu::compareThreshold(ref, res, threshold);
		pass		 = pass && pixelOk;
		if (!pixelOk)
		{
			log << TestLog::Message << "(" << x << "," << y << ")  "
				<< "(" << colorIndex << ") "
				<< "Exceeds: " << threshold << " diff:" << tcu::computeAbsDiff(ref, res) << "  res:" << res
				<< "  ref:" << ref << "  dst:" << tcu::RGBA(dstCol) << "  src:" << tcu::RGBA(srcCol)
				<< TestLog::EndMessage;
		}
	}

	m_testCtx.setTestResult(pass ? QP_TEST_RESULT_PASS : QP_TEST_RESULT_FAIL, pass ? "Pass" : "Fail (results differ)");
	delete[] resultBytes;
	return STOP;
}